

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O2

Eci * __thiscall SGP4::FindPositionSDP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  double dVar1;
  SatelliteException *this_00;
  double dVar2;
  double local_110;
  double local_108;
  double xn;
  double perturbed_x3thm1;
  double perturbed_x1mth2;
  double perturbed_x7thm1;
  double perturbed_xlcof;
  double local_d8;
  double xmdf;
  double em;
  double xmam;
  double perturbed_sinio;
  double perturbed_cosio;
  double perturbed_aycof;
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  double xnode;
  double xinc;
  double omgadf;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_d8 = (this->common_consts_).xmdot * tsince + (this->elements_).mean_anomoly_;
  xinc = (this->common_consts_).omgdot * tsince + (this->elements_).argument_perigee_;
  local_40 = tsince * tsince;
  local_80 = (this->common_consts_).xnodcf * local_40 +
             (this->common_consts_).xnodot * tsince + (this->elements_).ascending_node_;
  local_38 = (this->common_consts_).t2cof;
  local_98 = (this->common_consts_).c1;
  omgadf = (this->elements_).bstar_;
  local_50 = (this->common_consts_).c4;
  local_108 = (this->elements_).recovered_mean_motion_;
  xmdf = (this->elements_).eccentricity_;
  xnode = (this->elements_).inclination_;
  local_48 = tsince;
  DeepSpaceSecular(tsince,&this->elements_,&this->common_consts_,&this->deepspace_consts_,
                   &this->integrator_params_,&local_d8,&xinc,&local_80,&xmdf,&xnode,&local_108);
  if (local_108 <= 0.0) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (xn <= 0.0)");
  }
  else {
    local_40 = local_40 * local_38;
    omgadf = omgadf * local_50 * local_48;
    local_38 = pow(kXKE / local_108,0.6666666666666666);
    local_110 = xmdf - omgadf;
    em = local_40 * (this->elements_).recovered_mean_motion_ + local_d8;
    DeepSpacePeriodics(local_48,&this->deepspace_consts_,&local_110,&xnode,&xinc,&local_80,&em);
    if (-0.001 < local_110) {
      local_40 = 1e-06;
      if ((1e-06 <= local_110) && (local_40 = local_110, 0.999999 < local_110)) {
        local_40 = 0.999999;
      }
      dVar2 = -xnode;
      dVar1 = (double)(~-(ulong)(xnode < dVar2) & (ulong)xinc |
                      (ulong)(xinc + -3.141592653589793) & -(ulong)(xnode < dVar2));
      omgadf = xnode;
      local_50 = local_80;
      if (xnode < dVar2) {
        local_50 = local_80 + 3.141592653589793;
        omgadf = dVar2;
      }
      uStack_60 = 0x8000000000000000;
      local_a0 = em + dVar1 + local_50;
      dVar2 = 1.0 - local_98 * local_48;
      local_38 = local_38 * dVar2 * dVar2;
      uStack_90 = 0;
      perturbed_aycof = (double)__return_storage_ptr__;
      local_98 = dVar1;
      RecomputeConstants(omgadf,&xmam,&perturbed_sinio,&xn,&perturbed_x3thm1,&perturbed_x1mth2,
                         &perturbed_x7thm1,&perturbed_cosio);
      dVar1 = perturbed_aycof;
      perturbed_xlcof = (double)((long)(local_48 * 60000000.0) + (this->elements_).epoch_.m_encoded)
      ;
      CalculateFinalPositionVelocity
                ((Eci *)perturbed_aycof,(DateTime *)&perturbed_xlcof,local_40,local_38,local_98,
                 local_a0,local_50,omgadf,perturbed_x7thm1,perturbed_cosio,xn,perturbed_x3thm1,
                 perturbed_x1mth2,perturbed_sinio,xmam);
      return (Eci *)dVar1;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::FindPositionSDP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    double xinc;

    /*
     * update for secular gravity and atmospheric drag
     */
    double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    double xn = elements_.RecoveredMeanMotion();
    double em = elements_.Eccentricity();
    xinc = elements_.Inclination();

    DeepSpaceSecular(tsince,
                     elements_,
                     common_consts_,
                     deepspace_consts_,
                     integrator_params_,
                     xmdf,
                     omgadf,
                     xnode,
                     em,
                     xinc,
                     xn);

    if (xn <= 0.0)
    {
        throw SatelliteException("Error: (xn <= 0.0)");
    }

    a = pow(kXKE / xn, kTWOTHIRD) * tempa * tempa;
    e = em - tempe;
    double xmam = xmdf + elements_.RecoveredMeanMotion() * templ;

    DeepSpacePeriodics(tsince,
                       deepspace_consts_,
                       e,
                       xinc,
                       omgadf,
                       xnode,
                       xmam);

    /*
     * keeping xinc positive important unless you need to display xinc
     * and dislike negative inclinations
     */
    if (xinc < 0.0)
    {
        xinc = -xinc;
        xnode += kPI;
        omgadf -= kPI;
    }

    xl = xmam + omgadf + xnode;
    omega = omgadf;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * re-compute the perturbed values
     */
    double perturbed_sinio;
    double perturbed_cosio;
    double perturbed_x3thm1;
    double perturbed_x1mth2;
    double perturbed_x7thm1;
    double perturbed_xlcof;
    double perturbed_aycof;
    RecomputeConstants(xinc,
                       perturbed_sinio,
                       perturbed_cosio,
                       perturbed_x3thm1,
                       perturbed_x1mth2,
                       perturbed_x7thm1,
                       perturbed_xlcof,
                       perturbed_aycof);

    /*
     * using calculated values, find position and velocity
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          perturbed_xlcof,
                                          perturbed_aycof,
                                          perturbed_x3thm1,
                                          perturbed_x1mth2,
                                          perturbed_x7thm1,
                                          perturbed_cosio,
                                          perturbed_sinio);
}